

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utBlenderWork.cpp
# Opt level: O3

void __thiscall
BlenderWorkTest_work_279_Test::~BlenderWorkTest_work_279_Test(BlenderWorkTest_work_279_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BlenderWorkTest,work_279) {
    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/BLEND/test_279.blend", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(pTest != NULL);

    // material has 2 diffuse textures
    ASSERT_TRUE(pTest->HasMaterials());
    ASSERT_TRUE(pTest->HasMeshes());
    ASSERT_TRUE(pTest->mMeshes[0]->mNumVertices > 0);
    ASSERT_EQ(44u, pTest->mMeshes[0]->mNumFaces);
    EXPECT_EQ(1u, pTest->mNumMaterials);
}